

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  byte *pbVar1;
  handle hVar2;
  object oVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  PyObject *pPVar7;
  PyTypeObject *pPVar8;
  size_t sVar9;
  void *__dest;
  internals *piVar10;
  long lVar11;
  handle hVar12;
  object *object;
  PyTypeObject *pPVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  void *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  object local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  object local_58;
  object qualname;
  object name;
  handle local_40;
  tuple bases;
  object module;
  
  local_58.super_handle.m_ptr = (handle)PyUnicode_FromString(rec->name);
  if (local_58.super_handle.m_ptr != (PyObject *)0x0) {
    ((PyObject *)local_58.super_handle.m_ptr)->ob_refcnt =
         ((PyObject *)local_58.super_handle.m_ptr)->ob_refcnt + 1;
  }
  pPVar7 = (rec->scope).m_ptr;
  qualname.super_handle.m_ptr = local_58.super_handle.m_ptr;
  if (pPVar7 == (PyObject *)0x0) {
    bases.super_object.super_handle.m_ptr = (object)(handle)0x0;
  }
  else {
    iVar6 = _PyObject_TypeCheck(pPVar7,(PyTypeObject *)&PyModule_Type);
    if (iVar6 == 0) {
      bVar4 = hasattr((rec->scope).m_ptr,"__qualname__");
      if (bVar4) {
        local_78._8_8_ = (rec->scope).m_ptr;
        local_68._0_8_ = "__qualname__";
        local_68._8_8_ = (PyObject *)0x0;
        pPVar7 = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                           ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_78);
        local_a0._M_dataplus._M_p =
             (pointer)PyUnicode_FromFormat("%U.%U",pPVar7,qualname.super_handle.m_ptr);
        pybind11::object::operator=(&local_58,(object *)&local_a0);
        pybind11::object::~object((object *)&local_a0);
        pybind11::object::~object((object *)(local_68 + 8));
      }
    }
    hVar12.m_ptr = (rec->scope).m_ptr;
    bases.super_object.super_handle.m_ptr = (object)(handle)0x0;
    if (hVar12.m_ptr != (PyObject *)0x0) {
      bVar4 = hasattr(hVar12,"__module__");
      if (bVar4) {
        local_78._8_8_ = (rec->scope).m_ptr;
        local_68._0_8_ = "__module__";
        local_68._8_8_ = (PyObject *)0x0;
        accessor::operator_cast_to_object((accessor *)&local_a0);
LAB_00112047:
        pybind11::object::operator=(&bases.super_object,(object *)&local_a0);
        pybind11::object::~object((object *)&local_a0);
        pybind11::object::~object((object *)(local_68 + 8));
      }
      else {
        bVar4 = hasattr((rec->scope).m_ptr,"__name__");
        if (bVar4) {
          local_78._8_8_ = (rec->scope).m_ptr;
          local_68._0_8_ = "__name__";
          local_68._8_8_ = (PyObject *)0x0;
          accessor::operator_cast_to_object((accessor *)&local_a0);
          goto LAB_00112047;
        }
      }
      if ((handle)bases.super_object.super_handle.m_ptr != (handle)0x0) {
        str::str((str *)&local_80,&bases.super_object);
        cast<std::__cxx11::string>(&local_108,(pybind11 *)&local_80,object);
        std::operator+(&local_a0,&local_108,".");
        bVar4 = true;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,&local_a0,rec->name);
        goto LAB_001120d8;
      }
    }
  }
  std::__cxx11::string::string((string *)local_78,rec->name,(allocator *)&local_a0);
  bVar4 = false;
LAB_001120d8:
  pPVar8 = (PyTypeObject *)
           c_str<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78)
  ;
  std::__cxx11::string::~string((string *)local_78);
  if (bVar4) {
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_108);
    pybind11::object::~object(&local_80);
  }
  if ((rec->doc == (char *)0x0) || (options::global_state()::instance != '\x01')) {
    __dest = (void *)0x0;
  }
  else {
    sVar9 = strlen(rec->doc);
    __dest = (void *)PyObject_Malloc(sVar9 + 1);
    memcpy(__dest,rec->doc,sVar9 + 1);
  }
  piVar10 = get_internals();
  tuple::tuple((tuple *)&local_40,&(rec->bases).super_object);
  local_a8 = __dest;
  lVar11 = PyTuple_Size(local_40.m_ptr);
  if (lVar11 == 0) {
    pPVar7 = piVar10->instance_base;
  }
  else {
    local_78._8_8_ = local_40.m_ptr;
    local_68._0_8_ = (char *)0x0;
    local_68._8_8_ = (PyObject *)0x0;
    pPVar7 = accessor<pybind11::detail::accessor_policies::tuple_item>::ptr
                       ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_78);
    pybind11::object::~object((object *)(local_68 + 8));
  }
  pPVar13 = (PyTypeObject *)(rec->metaclass).m_ptr;
  if (pPVar13 == (PyTypeObject *)0x0) {
    pPVar13 = piVar10->default_metaclass;
  }
  hVar12.m_ptr = (*pPVar13->tp_alloc)(pPVar13,0);
  oVar3 = qualname;
  if (hVar12.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::string((string *)&local_c8,rec->name,(allocator *)&local_e8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   &local_c8,": Unable to create type object!");
    pybind11_fail((string *)local_78);
  }
  qualname.super_handle.m_ptr = (handle)(PyObject *)0x0;
  hVar12.m_ptr[0x35].ob_refcnt = (Py_ssize_t)oVar3.super_handle.m_ptr;
  if (local_58.super_handle.m_ptr != (PyObject *)0x0) {
    *(long *)local_58.super_handle.m_ptr = *(long *)local_58.super_handle.m_ptr + 1;
  }
  hVar12.m_ptr[0x36].ob_refcnt = (Py_ssize_t)local_58.super_handle.m_ptr;
  hVar12.m_ptr[1].ob_type = pPVar8;
  hVar12.m_ptr[0xb].ob_refcnt = (Py_ssize_t)local_a8;
  pPVar7->ob_refcnt = pPVar7->ob_refcnt + 1;
  hVar12.m_ptr[0x10].ob_refcnt = (Py_ssize_t)pPVar7;
  hVar12.m_ptr[2].ob_refcnt = 0x38;
  lVar11 = PyTuple_Size(local_40.m_ptr);
  hVar2.m_ptr = local_40.m_ptr;
  if (lVar11 != 0) {
    local_40.m_ptr = (PyObject *)0x0;
    hVar12.m_ptr[0x15].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  }
  hVar12.m_ptr[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  hVar12.m_ptr[6].ob_refcnt = (Py_ssize_t)&hVar12.m_ptr[0x1b].ob_type;
  hVar12.m_ptr[6].ob_type = (PyTypeObject *)(hVar12.m_ptr + 0x2f);
  hVar12.m_ptr[7].ob_refcnt = (Py_ssize_t)&hVar12.m_ptr[0x2d].ob_type;
  hVar12.m_ptr[5].ob_refcnt = (Py_ssize_t)&hVar12.m_ptr[0x19].ob_type;
  pbVar1 = (byte *)((long)&hVar12.m_ptr[10].ob_type + 1);
  *pbVar1 = *pbVar1 | 6;
  bVar5 = rec->field_0x60;
  if ((bVar5 & 2) != 0) {
    enable_dynamic_attributes((PyHeapTypeObject *)hVar12.m_ptr);
    bVar5 = rec->field_0x60;
  }
  if ((bVar5 & 4) != 0) {
    hVar12.m_ptr[10].ob_refcnt = (Py_ssize_t)(hVar12.m_ptr + 0x34);
    hVar12.m_ptr[0x34].ob_refcnt = (Py_ssize_t)pybind11_getbuffer;
    hVar12.m_ptr[0x34].ob_type = (PyTypeObject *)pybind11_releasebuffer;
  }
  iVar6 = PyType_Ready(hVar12.m_ptr);
  if (-1 < iVar6) {
    if (((rec->field_0x60 & 2) == 0) == (((ulong)hVar12.m_ptr[10].ob_type & 0x4000) == 0)) {
      hVar2.m_ptr = (rec->scope).m_ptr;
      if (hVar2.m_ptr == (PyObject *)0x0) {
        (hVar12.m_ptr)->ob_refcnt = (hVar12.m_ptr)->ob_refcnt + 1;
      }
      else {
        setattr(hVar2,rec->name,hVar12);
      }
      if ((handle)bases.super_object.super_handle.m_ptr != (handle)0x0) {
        setattr(hVar12,"__module__",(handle)bases.super_object.super_handle.m_ptr);
      }
      pybind11::object::~object((object *)&local_40);
      pybind11::object::~object(&bases.super_object);
      pybind11::object::~object(&local_58);
      pybind11::object::~object(&qualname);
      return hVar12.m_ptr;
    }
    __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CRPropa[P]sophia_next/lib/pybind11/include/pybind11/detail/class.h"
                  ,0x26e,"PyObject *pybind11::detail::make_new_python_type(const type_record &)");
  }
  std::__cxx11::string::string
            ((string *)&local_148,rec->name,(allocator *)((long)&name.super_handle.m_ptr + 7));
  std::operator+(&local_e8,&local_148,": PyType_Ready failed (");
  error_string_abi_cxx11_();
  std::operator+(&local_c8,&local_e8,&local_128);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                 &local_c8,")!");
  pybind11_fail((string *)local_78);
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

    auto qualname = name;
    if (rec.scope && !PyModule_Check(rec.scope.ptr()) && hasattr(rec.scope, "__qualname__")) {
#if PY_MAJOR_VERSION >= 3
        qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
#else
        qualname = str(rec.scope.attr("__qualname__").cast<std::string>() + "." + rec.name);
#endif
    }

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

    auto full_name = c_str(
#if !defined(PYPY_VERSION)
        module ? str(module).cast<std::string>() + "." + rec.name :
#endif
        rec.name);

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = qualname.inc_ref().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = full_name;
    type->tp_doc = tp_doc;
    type->tp_base = type_incref((PyTypeObject *)base);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;
#if PY_VERSION_HEX >= 0x03050000
    type->tp_as_async = &heap_type->as_async;
#endif

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);
    else
        Py_INCREF(type); // Keep it alive forever (reference leak)

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    PYBIND11_SET_OLDPY_QUALNAME(type, qualname);

    return (PyObject *) type;
}